

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O1

yyjson_mut_val *
duckdb_yyjson::unsafe_yyjson_mut_ptr_getx
          (yyjson_mut_val *val,char *ptr,size_t ptr_len,yyjson_ptr_ctx *ctx,yyjson_ptr_err *err)

{
  int iVar1;
  ulong uVar2;
  yyjson_mut_val *pyVar3;
  long lVar4;
  char *pcVar5;
  yyjson_ptr_code yVar6;
  byte *pbVar7;
  byte *pbVar8;
  byte *pbVar9;
  byte *pbVar10;
  byte *unaff_RBP;
  byte *__s2;
  byte bVar11;
  bool bVar12;
  ulong uVar13;
  ulong uVar14;
  byte bVar15;
  yyjson_mut_val *pyVar16;
  ulong unaff_R15;
  ulong uVar17;
  bool bVar18;
  long local_40;
  
  pbVar8 = (byte *)(ptr + ptr_len);
  pyVar16 = (yyjson_mut_val *)0x0;
  bVar12 = false;
  pbVar10 = (byte *)ptr;
  do {
    __s2 = pbVar10 + 1;
    for (pbVar10 = __s2; ((pbVar10 < pbVar8 && (*pbVar10 != 0x2f)) && (*pbVar10 != 0x7e));
        pbVar10 = pbVar10 + 1) {
    }
    if ((pbVar10 == pbVar8) || (*pbVar10 != 0x7e)) {
      unaff_RBP = pbVar10 + -(long)__s2;
      local_40 = 0;
    }
    else {
      if (pbVar10 < pbVar8) {
        lVar4 = 0;
        do {
          pbVar9 = pbVar10 + 1;
          if (*pbVar10 == 0x2f) break;
          if (*pbVar10 == 0x7e) {
            if ((pbVar9 == pbVar8) || ((*pbVar9 & 0xfe) != 0x30)) {
              __s2 = (byte *)0x0;
              goto LAB_018b6f0a;
            }
            lVar4 = lVar4 + 1;
          }
          pbVar10 = pbVar9;
        } while (pbVar9 < pbVar8);
      }
      else {
        lVar4 = 0;
      }
      unaff_RBP = pbVar10 + (-(long)__s2 - lVar4);
      local_40 = lVar4;
    }
LAB_018b6f0a:
    if (__s2 == (byte *)0x0) {
      if (err == (yyjson_ptr_err *)0x0) {
        return (yyjson_mut_val *)0x0;
      }
      pcVar5 = "invalid escaped character";
      yVar6 = 2;
      goto LAB_018b7222;
    }
    uVar14 = val->tag;
    bVar15 = (byte)uVar14 & 7;
    if (bVar15 == 7) {
      if (uVar14 < 0x100) {
LAB_018b6f2c:
        pyVar16 = (yyjson_mut_val *)0x0;
        goto LAB_018b71a3;
      }
      uVar14 = uVar14 >> 8;
      pyVar16 = (yyjson_mut_val *)(val->uni).u64;
      do {
        pyVar3 = pyVar16->next->next;
        if ((byte *)(pyVar3->tag >> 8) == unaff_RBP) {
          if (local_40 == 0) {
            iVar1 = bcmp((pyVar3->uni).ptr,__s2,(size_t)unaff_RBP);
            bVar18 = iVar1 == 0;
          }
          else {
            bVar18 = unaff_RBP == (byte *)0x0;
            if (unaff_RBP != (byte *)0x0) {
              pbVar7 = (byte *)0x0;
              pbVar9 = __s2;
              do {
                if (*pbVar9 == 0x7e) {
                  bVar11 = 0x2f;
                  if (pbVar9[1] == 0x30) {
                    bVar11 = 0x7e;
                  }
                  if (bVar11 != (pyVar3->uni).str[(long)pbVar7]) goto LAB_018b6fe2;
                  pbVar9 = pbVar9 + 1;
                }
                else if ((pyVar3->uni).str[(long)pbVar7] != *pbVar9) goto LAB_018b6fe2;
                pbVar9 = pbVar9 + 1;
                pbVar7 = pbVar7 + 1;
                bVar18 = unaff_RBP == pbVar7;
              } while (!bVar18);
            }
          }
          if (bVar18) {
            pyVar3 = pyVar3->next;
            goto LAB_018b71a5;
          }
        }
LAB_018b6fe2:
        uVar14 = uVar14 - 1;
        pyVar16 = pyVar3;
      } while (uVar14 != 0);
      pyVar16 = (yyjson_mut_val *)0x0;
      pyVar3 = (yyjson_mut_val *)0x0;
    }
    else {
      if (bVar15 == 6) {
        if (uVar14 < 0x100) {
          if ((unaff_RBP == (byte *)0x1) && ((*__s2 == 0x30 || (*__s2 == 0x2d)))) {
            bVar12 = true;
            goto LAB_018b6f2c;
          }
        }
        else {
          uVar17 = unaff_R15;
          if (unaff_RBP + -0x14 < (byte *)0xffffffffffffffed) {
            bVar12 = false;
          }
          else {
            if (*__s2 == 0x2d) {
              uVar2 = 0xffffffffffffffff;
            }
            else {
              if (*__s2 != 0x30) {
                bVar12 = (long)unaff_RBP < 1;
                if (((long)unaff_RBP < 1) || (uVar2 = (ulong)*__s2 - 0x30, 9 < uVar2)) {
                  uVar13 = 0;
                }
                else {
                  uVar13 = 0;
                  pbVar9 = __s2;
                  do {
                    pbVar9 = pbVar9 + 1;
                    uVar13 = uVar2 + uVar13 * 10;
                    bVar12 = __s2 + (long)unaff_RBP <= pbVar9;
                    if (bVar12) break;
                    uVar2 = (ulong)*pbVar9 - 0x30;
                  } while (uVar2 < 10);
                }
                bVar12 = (bool)(uVar13 != 0 & bVar12);
                if (bVar12) {
                  uVar17 = uVar13;
                }
                goto LAB_018b70d0;
              }
              uVar2 = 0;
            }
            bVar12 = unaff_RBP < (byte *)0x2;
            if (bVar12) {
              uVar17 = uVar2;
            }
          }
LAB_018b70d0:
          unaff_R15 = uVar17;
          if (bVar12) {
            bVar12 = uVar17 == 0xffffffffffffffff || uVar17 == uVar14 >> 8;
            if (uVar14 >> 8 <= uVar17) goto LAB_018b6f2c;
            pyVar16 = (yyjson_mut_val *)(val->uni).u64;
            unaff_R15 = uVar17 - 1;
            if (uVar17 != 0) {
              do {
                pyVar16 = pyVar16->next;
                uVar17 = uVar17 - 1;
              } while (uVar17 != 0);
              unaff_R15 = 0xffffffffffffffff;
            }
            pyVar3 = pyVar16->next;
            goto LAB_018b71a5;
          }
        }
        pyVar16 = (yyjson_mut_val *)0x0;
        bVar12 = false;
      }
LAB_018b71a3:
      pyVar3 = (yyjson_mut_val *)0x0;
    }
LAB_018b71a5:
    if (((ctx != (yyjson_ptr_ctx *)0x0) && (pbVar10 == pbVar8)) &&
       ((bVar15 == 7 || ((bVar15 == 6 && ((pyVar3 != (yyjson_mut_val *)0x0 || (bVar12)))))))) {
      ctx->ctn = val;
      ctx->pre = pyVar16;
    }
    if (pyVar3 == (yyjson_mut_val *)0x0) {
      if (err == (yyjson_ptr_err *)0x0) {
        return (yyjson_mut_val *)0x0;
      }
      pcVar5 = "JSON pointer cannot be resolved";
      yVar6 = 3;
      pbVar10 = __s2;
LAB_018b7222:
      err->code = yVar6;
      err->msg = pcVar5;
      err->pos = (long)pbVar10 - (long)ptr;
      return (yyjson_mut_val *)0x0;
    }
    val = pyVar3;
    if (pbVar10 == pbVar8) {
      return pyVar3;
    }
  } while( true );
}

Assistant:

yyjson_mut_val *unsafe_yyjson_mut_ptr_getx(yyjson_mut_val *val,
                                           const char *ptr,
                                           size_t ptr_len,
                                           yyjson_ptr_ctx *ctx,
                                           yyjson_ptr_err *err) {

    const char *hdr = ptr, *end = ptr + ptr_len, *token;
    usize len, esc;
    yyjson_mut_val *ctn, *pre = NULL;
    yyjson_type type;
    bool idx_is_last = false;

    while (true) {
        token = ptr_next_token(&ptr, end, &len, &esc);
        if (unlikely(!token)) return_err_syntax(NULL, ptr - hdr);
        ctn = val;
        type = unsafe_yyjson_get_type(val);
        if (type == YYJSON_TYPE_OBJ) {
            val = ptr_mut_obj_get(val, token, len, esc, &pre);
        } else if (type == YYJSON_TYPE_ARR) {
            val = ptr_mut_arr_get(val, token, len, esc, &pre, &idx_is_last);
        } else {
            val = NULL;
        }
        if (ctx && (ptr == end)) {
            if (type == YYJSON_TYPE_OBJ ||
                (type == YYJSON_TYPE_ARR && (val || idx_is_last))) {
                ctx->ctn = ctn;
                ctx->pre = pre;
            }
        }
        if (!val) return_err_resolve(NULL, token - hdr);
        if (ptr == end) return val;
    }
}